

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall
kj::Exception::Exception(Exception *this,Type type,char *file,int line,String *description)

{
  char *pcVar1;
  String *pSVar2;
  size_t extraout_RDX;
  StringPtr filename;
  StringPtr local_50;
  ArrayPtr<const_char> local_40;
  String *local_30;
  String *description_local;
  char *pcStack_20;
  int line_local;
  char *file_local;
  Exception *pEStack_10;
  Type type_local;
  Exception *this_local;
  
  local_30 = description;
  description_local._4_4_ = line;
  pcStack_20 = file;
  file_local._4_4_ = type;
  pEStack_10 = this;
  String::String(&this->ownFile);
  StringPtr::StringPtr(&local_50,pcStack_20);
  filename.content.size_ = extraout_RDX;
  filename.content.ptr = (char *)local_50.content.size_;
  local_40 = (ArrayPtr<const_char>)trimSourceFilename((kj *)local_50.content.ptr,filename);
  pcVar1 = StringPtr::cStr((StringPtr *)&local_40);
  this->file = pcVar1;
  this->line = description_local._4_4_;
  this->type = file_local._4_4_;
  pSVar2 = mv<kj::String>(description);
  String::String(&this->description,pSVar2);
  Maybe<kj::Own<kj::Exception::Context>_>::Maybe(&this->context);
  this->traceCount = 0;
  return;
}

Assistant:

Exception::Exception(Type type, const char* file, int line, String description) noexcept
    : file(trimSourceFilename(file).cStr()), line(line), type(type), description(mv(description)),
      traceCount(0) {}